

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O3

int connection_close(CONNECTION_HANDLE connection,char *condition_value,char *description,
                    AMQP_VALUE info)

{
  AMQP_TYPE AVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  char *pcVar5;
  
  if (connection == (CONNECTION_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar2 = 0x583;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x583;
    }
    pcVar5 = "NULL connection";
    iVar4 = 0x582;
  }
  else {
    if (((info == (AMQP_VALUE)0x0) || (AVar1 = amqpvalue_get_type(info), AVar1 == AMQP_TYPE_MAP)) ||
       (AVar1 = amqpvalue_get_type(info), AVar1 == AMQP_TYPE_NULL)) {
      if (condition_value == (char *)0x0) {
        iVar2 = send_close_frame(connection,(ERROR_HANDLE)0x0);
        if ((iVar2 != 0) && (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                    ,"connection_close",0x596,1,"Sending CLOSE frame failed");
        }
        connection_set_state(connection,CONNECTION_STATE_END);
      }
      else {
        close_connection_with_error(connection,condition_value,description,info);
      }
      iVar2 = xio_close(connection->io,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
      if ((iVar2 != 0) && (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                  ,"connection_close",0x59e,1,"xio_close failed");
      }
      connection->field_0xe0 = connection->field_0xe0 | 1;
      return 0;
    }
    p_Var3 = xlogging_get_log_function();
    iVar2 = 0x58a;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x58a;
    }
    pcVar5 = "Invalid info, expected a map";
    iVar4 = 0x589;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
            ,"connection_close",iVar4,1,pcVar5);
  return iVar2;
}

Assistant:

int connection_close(CONNECTION_HANDLE connection, const char* condition_value, const char* description, AMQP_VALUE info)
{
    int result;

    if (connection == NULL)
    {
        LogError("NULL connection");
        result = MU_FAILURE;
    }
    else if ((info != NULL) &&
        (amqpvalue_get_type(info) != AMQP_TYPE_MAP) &&
        (amqpvalue_get_type(info) != AMQP_TYPE_NULL))
    {
        LogError("Invalid info, expected a map");
        result = MU_FAILURE;
    }
    else
    {
        if (condition_value != NULL)
        {
            close_connection_with_error(connection, condition_value, description, info);
        }
        else
        {
            if (send_close_frame(connection, NULL) != 0)
            {
                LogError("Sending CLOSE frame failed");
            }

            connection_set_state(connection, CONNECTION_STATE_END);
        }

        if (xio_close(connection->io, NULL, NULL) != 0)
        {
            LogError("xio_close failed");
        }

        connection->is_underlying_io_open = 1;

        result = 0;
    }

    return result;
}